

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall
cfd::core::Psbt::SetTxInUtxo
          (Psbt *this,uint32_t index,TxOutReference *txout,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  uint32_t vout;
  void *pvVar1;
  bool bVar2;
  int64_t iVar3;
  CfdException *pCVar4;
  long lVar5;
  undefined4 in_register_00000034;
  long lVar6;
  allocator local_10d;
  int ret;
  undefined1 local_108 [8];
  int local_100;
  char *local_f8;
  wally_tx_output *output;
  ulong local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> script_val;
  Script script;
  Script new_redeem_script;
  Txid txid;
  
  (*this->_vptr_Psbt[2])(this,CONCAT44(in_register_00000034,index),0x8ff,"SetTxInUtxo");
  pvVar1 = this->wally_psbt_pointer_;
  lVar6 = *(long *)(*(long *)((long)pvVar1 + 8) + 8);
  lVar5 = (ulong)index * 0xd0;
  vout = *(uint32_t *)(lVar6 + 0x20 + lVar5);
  local_e0 = (ulong)index;
  ByteData::ByteData((ByteData *)&new_redeem_script,(uint8_t *)(lVar6 + lVar5),0x20);
  ByteData256::ByteData256((ByteData256 *)&script,(ByteData *)&new_redeem_script);
  Txid::Txid(&txid,(ByteData256 *)&script);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&script);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&new_redeem_script);
  Script::Script(&script,&(txout->super_AbstractTxOutReference).locking_script_);
  Script::Script(&new_redeem_script,redeem_script);
  bVar2 = ValidatePsbtUtxo(&txid,vout,&script,redeem_script,key_list,&new_redeem_script);
  if (!bVar2) {
    local_108 = (undefined1  [8])0x22e1c0;
    local_100 = 0x90c;
    local_f8 = "SetTxInUtxo";
    logger::warn<>((CfdSourceLocation *)local_108,"non witness output is not supported.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_108,"psbt utxo type error.",(allocator *)&script_val);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_108);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  output = (wally_tx_output *)0x0;
  Script::GetData((ByteData *)local_108,&script);
  ByteData::GetBytes(&script_val,(ByteData *)local_108);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
  local_108 = (undefined1  [8])(txout->super_AbstractTxOutReference).value_.amount_;
  local_100 = CONCAT31(local_100._1_3_,(txout->super_AbstractTxOutReference).value_.ignore_check_);
  iVar3 = Amount::GetSatoshiValue((Amount *)local_108);
  ret = wally_tx_output_init_alloc
                  (iVar3,script_val.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                   (long)script_val.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)script_val.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,&output);
  if (ret == 0) {
    lVar6 = local_e0 * 0x110;
    ret = wally_psbt_input_set_witness_utxo(*(long *)((long)pvVar1 + 0x10) + lVar6,output);
    wally_tx_output_free(output);
    if (ret == 0) {
      SetPsbtTxInScriptAndKeyList
                ((wally_psbt_input *)(lVar6 + *(long *)((long)pvVar1 + 0x10)),true,
                 &new_redeem_script,key_list,&script);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&script_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      Script::~Script(&new_redeem_script);
      Script::~Script(&script);
      Txid::~Txid(&txid);
      return;
    }
    local_108 = (undefined1  [8])0x22e1c0;
    local_100 = 0x91e;
    local_f8 = "SetTxInUtxo";
    logger::warn<int&>((CfdSourceLocation *)local_108,"wally_psbt_input_set_witness_utxo NG[{}]",
                       &ret);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_108,"psbt add witness utxo error.",&local_10d);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_108);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_108 = (undefined1  [8])0x22e1c0;
  local_100 = 0x916;
  local_f8 = "SetTxInUtxo";
  logger::warn<int&>((CfdSourceLocation *)local_108,"wally_tx_output_init_alloc NG[{}]",&ret);
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_108,"psbt alloc output error.",&local_10d);
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_108);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInUtxo(
    uint32_t index, const TxOutReference &txout, const Script &redeem_script,
    const std::vector<KeyData> &key_list) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint8_t *txhash = psbt_pointer->tx->inputs[index].txhash;
  uint32_t vout = psbt_pointer->tx->inputs[index].index;
  Txid txid(ByteData256(
      ByteData(txhash, sizeof(psbt_pointer->tx->inputs[index].txhash))));

  auto script = txout.GetLockingScript();
  Script new_redeem_script = redeem_script;
  bool is_witness = ValidatePsbtUtxo(
      txid, vout, script, redeem_script, key_list, &new_redeem_script);
  if (!is_witness) {
    warn(CFD_LOG_SOURCE, "non witness output is not supported.");
    throw CfdException(kCfdIllegalArgumentError, "psbt utxo type error.");
  }

  struct wally_tx_output *output = nullptr;
  auto script_val = script.GetData().GetBytes();
  int ret = wally_tx_output_init_alloc(
      static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
      script_val.data(), script_val.size(), &output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_output_init_alloc NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt alloc output error.");
  }

  ret =
      wally_psbt_input_set_witness_utxo(&psbt_pointer->inputs[index], output);
  wally_tx_output_free(output);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
    throw CfdException(
        kCfdIllegalArgumentError, "psbt add witness utxo error.");
  }

  SetPsbtTxInScriptAndKeyList(
      &psbt_pointer->inputs[index], is_witness, new_redeem_script, key_list,
      script);
}